

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLcode multi_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  undefined1 *puVar1;
  uint uVar2;
  connectdata *conn;
  _func_CURLcode_Curl_easy_ptr_CURLcode__Bool *p_Var3;
  long lVar4;
  _Bool _Var5;
  int iVar6;
  long lVar7;
  CURLcode CVar8;
  dynbuf *s;
  ulong uVar9;
  char buffer [256];
  char acStack_138 [264];
  
  CVar8 = CURLE_OK;
  if (((data->state).field_0x6d1 & 8) == 0) {
    conn = data->conn;
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    (*Curl_cfree)((data->req).location);
    (data->req).location = (char *)0x0;
    if ((status < CURLE_BAD_FUNCTION_ARGUMENT) &&
       ((0x40004800000U >> ((ulong)status & 0x3f) & 1) != 0)) {
      premature = true;
    }
    p_Var3 = conn->handler->done;
    if (p_Var3 != (_func_CURLcode_Curl_easy_ptr_CURLcode__Bool *)0x0) {
      status = (*p_Var3)(data,status,premature);
    }
    CVar8 = CURLE_ABORTED_BY_CALLBACK;
    if (status != CURLE_ABORTED_BY_CALLBACK) {
      iVar6 = Curl_pgrsDone(data);
      CVar8 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar6 == 0) {
        CVar8 = status;
      }
      if (status != CURLE_OK) {
        CVar8 = status;
      }
    }
    process_pending_handles(data->multi);
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    Curl_detach_connection(data);
    if ((conn->easyq).size == 0) {
      puVar1 = &(data->state).field_0x6d1;
      *puVar1 = *puVar1 | 8;
      if (conn->dns_entry != (Curl_dns_entry *)0x0) {
        Curl_resolv_unlock(data,conn->dns_entry);
        conn->dns_entry = (Curl_dns_entry *)0x0;
      }
      Curl_hostcache_prune(data);
      (*Curl_cfree)((data->state).ulbuf);
      (data->state).ulbuf = (char *)0x0;
      if ((data->state).tempcount != 0) {
        s = &(data->state).tempwrite[0].b;
        uVar9 = 0;
        do {
          Curl_dyn_free(s);
          uVar9 = uVar9 + 1;
          s = (dynbuf *)&s[1].leng;
        } while (uVar9 < (data->state).tempcount);
      }
      (data->state).tempcount = 0;
      if (((((((data->set).field_0x8e5 & 0x20) == 0) || (conn->http_ntlm_state == NTLMSTATE_TYPE2))
           || (conn->proxy_ntlm_state == NTLMSTATE_TYPE2)) &&
          (uVar2 = *(uint *)&(conn->bits).field_0x4, (uVar2 & 0x40) == 0)) &&
         ((premature == false || ((conn->handler->flags & 0x200) != 0)))) {
        lVar7 = 0xf0;
        if (((uVar2 & 2) == 0) &&
           ((lVar7 = 0x130, (uVar2 & 1) == 0 && (lVar7 = 0xd0, (uVar2 >> 9 & 1) == 0)))) {
          lVar7 = 0xa0;
        }
        lVar4 = conn->connection_id;
        curl_msnprintf(acStack_138,0x100,"Connection #%ld to host %s left intact",lVar4,
                       *(undefined8 *)((conn->chunk).hexbuffer + lVar7 + -0x3d));
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
        }
        _Var5 = Curl_conncache_return_conn(data,conn);
        if (_Var5) {
          (data->state).lastconnect_id = lVar4;
          Curl_infof(data,"%s",acStack_138);
        }
        else {
          (data->state).lastconnect_id = -1;
        }
      }
      else {
        Curl_conncontrol(conn,1);
        Curl_conncache_remove_conn(data,conn,false);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
        }
        Curl_disconnect(data,conn,premature);
      }
      (*Curl_cfree)((data->state).buffer);
      (data->state).buffer = (char *)0x0;
    }
    else {
      CVar8 = CURLE_OK;
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
      }
    }
  }
  return CVar8;
}

Assistant:

static CURLcode multi_done(struct Curl_easy *data,
                           CURLcode status,  /* an error if this is called
                                                after an error was detected */
                           bool premature)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  unsigned int i;

  DEBUGF(infof(data, "multi_done: status: %d prem: %d done: %d",
               (int)status, (int)premature, data->state.done));

  if(data->state.done)
    /* Stop if multi_done() has already been called */
    return CURLE_OK;

  /* Stop the resolver and free its own resources (but not dns_entry yet). */
  Curl_resolver_kill(data);

  /* Cleanup possible redirect junk */
  Curl_safefree(data->req.newurl);
  Curl_safefree(data->req.location);

  switch(status) {
  case CURLE_ABORTED_BY_CALLBACK:
  case CURLE_READ_ERROR:
  case CURLE_WRITE_ERROR:
    /* When we're aborted due to a callback return code it basically have to
       be counted as premature as there is trouble ahead if we don't. We have
       many callbacks and protocols work differently, we could potentially do
       this more fine-grained in the future. */
    premature = TRUE;
  default:
    break;
  }

  /* this calls the protocol-specific function pointer previously set */
  if(conn->handler->done)
    result = conn->handler->done(data, status, premature);
  else
    result = status;

  if(CURLE_ABORTED_BY_CALLBACK != result) {
    /* avoid this if we already aborted by callback to avoid this calling
       another callback */
    int rc = Curl_pgrsDone(data);
    if(!result && rc)
      result = CURLE_ABORTED_BY_CALLBACK;
  }

  process_pending_handles(data->multi); /* connection / multiplex */

  CONNCACHE_LOCK(data);
  Curl_detach_connection(data);
  if(CONN_INUSE(conn)) {
    /* Stop if still used. */
    CONNCACHE_UNLOCK(data);
    DEBUGF(infof(data, "Connection still in use %zu, "
                 "no more multi_done now!",
                 conn->easyq.size));
    return CURLE_OK;
  }

  data->state.done = TRUE; /* called just now! */

  if(conn->dns_entry) {
    Curl_resolv_unlock(data, conn->dns_entry); /* done with this */
    conn->dns_entry = NULL;
  }
  Curl_hostcache_prune(data);
  Curl_safefree(data->state.ulbuf);

  /* if the transfer was completed in a paused state there can be buffered
     data left to free */
  for(i = 0; i < data->state.tempcount; i++) {
    Curl_dyn_free(&data->state.tempwrite[i].b);
  }
  data->state.tempcount = 0;

  /* if data->set.reuse_forbid is TRUE, it means the libcurl client has
     forced us to close this connection. This is ignored for requests taking
     place in a NTLM/NEGOTIATE authentication handshake

     if conn->bits.close is TRUE, it means that the connection should be
     closed in spite of all our efforts to be nice, due to protocol
     restrictions in our or the server's end

     if premature is TRUE, it means this connection was said to be DONE before
     the entire request operation is complete and thus we can't know in what
     state it is for re-using, so we're forced to close it. In a perfect world
     we can add code that keep track of if we really must close it here or not,
     but currently we have no such detail knowledge.
  */

  if((data->set.reuse_forbid
#if defined(USE_NTLM)
      && !(conn->http_ntlm_state == NTLMSTATE_TYPE2 ||
           conn->proxy_ntlm_state == NTLMSTATE_TYPE2)
#endif
#if defined(USE_SPNEGO)
      && !(conn->http_negotiate_state == GSS_AUTHRECV ||
           conn->proxy_negotiate_state == GSS_AUTHRECV)
#endif
     ) || conn->bits.close
       || (premature && !(conn->handler->flags & PROTOPT_STREAM))) {
    connclose(conn, "disconnecting");
    Curl_conncache_remove_conn(data, conn, FALSE);
    CONNCACHE_UNLOCK(data);
    Curl_disconnect(data, conn, premature);
  }
  else {
    char buffer[256];
    const char *host =
#ifndef CURL_DISABLE_PROXY
      conn->bits.socksproxy ?
      conn->socks_proxy.host.dispname :
      conn->bits.httpproxy ? conn->http_proxy.host.dispname :
#endif
      conn->bits.conn_to_host ? conn->conn_to_host.dispname :
      conn->host.dispname;
    /* create string before returning the connection */
    long connection_id = conn->connection_id;
    msnprintf(buffer, sizeof(buffer),
              "Connection #%ld to host %s left intact",
              connection_id, host);
    /* the connection is no longer in use by this transfer */
    CONNCACHE_UNLOCK(data);
    if(Curl_conncache_return_conn(data, conn)) {
      /* remember the most recently used connection */
      data->state.lastconnect_id = connection_id;
      infof(data, "%s", buffer);
    }
    else
      data->state.lastconnect_id = -1;
  }

  Curl_safefree(data->state.buffer);
  return result;
}